

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O1

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::subspan
          (span<int,_18446744073709551615UL> *this,size_type offset,size_type count)

{
  ulong uVar1;
  contract_violation *this_00;
  size_type count_00;
  span<int,_18446744073709551615UL> local_20;
  
  uVar1 = this->size_;
  if ((offset <= uVar1) && (count + offset <= uVar1 || count == 0xffffffffffffffff)) {
    count_00 = uVar1 - offset;
    if (count != 0xffffffffffffffff) {
      count_00 = count;
    }
    span<int_*,_0>(&local_20,this->data_ + offset,count_00);
    return local_20;
  }
  this_00 = (contract_violation *)__cxa_allocate_exception(0x10);
  detail::contract_violation::contract_violation
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1209: Precondition violation."
            );
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    subspan( size_type offset, size_type count = static_cast<size_type>(dynamic_extent) ) const
    {
        span_EXPECTS(
            ( ( detail::is_positive( offset ) && offset <= size() ) ) &&
            ( count == static_cast<size_type>(dynamic_extent) || ( detail::is_positive( count ) && offset + count <= size() ) )
        );

        return span< element_type, dynamic_extent >(
            data() + offset, count == static_cast<size_type>(dynamic_extent) ? size() - offset : count );
    }